

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::BooleanDatatypeValidator::BooleanDatatypeValidator
          (BooleanDatatypeValidator *this,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,int finalSet,MemoryManager *manager)

{
  bool bVar1;
  InvalidDatatypeFacetException *pIVar2;
  KVStringPair *toCopy;
  XMLCh *str1;
  XMLCh *pattern;
  undefined1 local_b8 [8];
  KVStringPair pair;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  XMLCh *value;
  XMLCh *key;
  MemoryManager *manager_local;
  int finalSet_local;
  RefArrayVectorOf<char16_t> *enums_local;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets_local;
  DatatypeValidator *baseValidator_local;
  BooleanDatatypeValidator *this_local;
  
  DatatypeValidator::DatatypeValidator
            (&this->super_DatatypeValidator,baseValidator,facets,finalSet,Boolean,manager);
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__BooleanDatatypeValidator_005342e0;
  if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
      if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
        (*(enums->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])();
      }
      pIVar2 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x36,FACET_Invalid_Tag,"enumeration",(char *)0x0,(char *)0x0,(char *)0x0,manager);
      __cxa_throw(pIVar2,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
               &pair.fMemoryManager,facets,false,manager);
    while( true ) {
      bVar1 = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
              hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                               *)&pair.fMemoryManager);
      if (!bVar1) break;
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                            *)&pair.fMemoryManager);
      KVStringPair::KVStringPair((KVStringPair *)local_b8,toCopy);
      str1 = KVStringPair::getKey((KVStringPair *)local_b8);
      pattern = KVStringPair::getValue((KVStringPair *)local_b8);
      bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_PATTERN);
      if (!bVar1) {
        pIVar2 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                   ,0x4d,FACET_Invalid_Tag,str1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar2,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      DatatypeValidator::setPattern(&this->super_DatatypeValidator,pattern);
      DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,8);
      KVStringPair::~KVStringPair((KVStringPair *)local_b8);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
               &pair.fMemoryManager);
  }
  return;
}

Assistant:

BooleanDatatypeValidator::BooleanDatatypeValidator(
                          DatatypeValidator*            const baseValidator
                        , RefHashTableOf<KVStringPair>* const facets
                        , RefArrayVectorOf<XMLCh>*      const enums
                        , const int                           finalSet
                        , MemoryManager* const                manager)
:DatatypeValidator(baseValidator, facets, finalSet, DatatypeValidator::Boolean, manager)
{

    // Set Facets if any defined
    if ( facets )
    {

        // Boolean shall NOT have enumeration
        if (enums) {
            delete enums;
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                    , XMLExcepts::FACET_Invalid_Tag
                    , "enumeration"
                    , manager);
        }

        XMLCh* key;
        XMLCh* value;
        RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

        while (e.hasMoreElements())
        {
            KVStringPair pair = e.nextElement();
            key = pair.getKey();
            value = pair.getValue();

            if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
            {
                setPattern(value);
                setFacetsDefined(DatatypeValidator::FACET_PATTERN);
            }
            else
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                        , XMLExcepts::FACET_Invalid_Tag
                        , key
                        , manager);
            }

        }

    }// End of facet setting
}